

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

void __thiscall
deqp::gls::BuiltinPrecisionTests::DefaultSampling<tcu::Matrix<float,_4,_4>_>::genFixeds
          (DefaultSampling<tcu::Matrix<float,_4,_4>_> *this,FloatFormat *fmt,
          vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_> *dst)

{
  Vector<float,_4> *pVVar1;
  size_t scalarNdx;
  ulong uVar2;
  long lVar3;
  float fVar4;
  float local_7c;
  vector<float,_std::allocator<float>_> scalars;
  Value mat;
  
  scalars.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  scalars.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  scalars.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  DefaultSampling<float>::genFixeds((DefaultSampling<float> *)this,fmt,&scalars);
  lVar3 = 0;
  for (uVar2 = 0;
      uVar2 < (ulong)((long)scalars.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)scalars.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2); uVar2 = uVar2 + 1) {
    tcu::Matrix<float,_4,_4>::Matrix
              (&mat,(float *)((long)scalars.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start + lVar3));
    std::vector<tcu::Matrix<float,4,4>,std::allocator<tcu::Matrix<float,4,4>>>::
    emplace_back<tcu::Matrix<float,4,4>>
              ((vector<tcu::Matrix<float,4,4>,std::allocator<tcu::Matrix<float,4,4>>> *)dst,&mat);
    lVar3 = lVar3 + 4;
  }
  local_7c = 0.0;
  tcu::Matrix<float,_4,_4>::Matrix(&mat,&local_7c);
  pVVar1 = mat.m_data.m_data + 3;
  mat.m_data.m_data[0].m_data[0] = 1.0;
  fVar4 = 1.0;
  for (lVar3 = 0x30; lVar3 != -0x10; lVar3 = lVar3 + -0x10) {
    pVVar1->m_data[0] = fVar4;
    fVar4 = fVar4 + fVar4;
    pVVar1 = (Vector<float,_4> *)(pVVar1[-1].m_data + 1);
  }
  std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::push_back
            (dst,&mat);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&scalars.super__Vector_base<float,_std::allocator<float>_>);
  return;
}

Assistant:

void	genFixeds	(const FloatFormat& fmt, vector<Value>& dst) const
	{
		vector<T> scalars;

		instance<DefaultSampling<T> >().genFixeds(fmt, scalars);

		for (size_t scalarNdx = 0; scalarNdx < scalars.size(); ++scalarNdx)
			dst.push_back(Value(scalars[scalarNdx]));

		if (Columns == Rows)
		{
			Value	mat	(0.0);
			T		x	= T(1.0f);
			mat[0][0] = x;
			for (int ndx = 0; ndx < Columns; ++ndx)
			{
				mat[Columns-1-ndx][ndx] = x;
				x *= T(2.0f);
			}
			dst.push_back(mat);
		}
	}